

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_UpdateEpsAbs_Test::OsqpTest_UpdateEpsAbs_Test
          (OsqpTest_UpdateEpsAbs_Test *this)

{
  OsqpTest_UpdateEpsAbs_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__OsqpTest_UpdateEpsAbs_Test_0031f5c0;
  return;
}

Assistant:

TEST(OsqpTest, UpdateEpsAbs) {
  OsqpSettings settings;
  // Check for termination after every iteration.
  settings.check_termination = 1;
  // Disable eps_rel to isolate the effect of eps_abs.
  settings.eps_rel = 0.0;
  // Set a very loose eps_abs value.
  settings.eps_abs = 1;

  // Solve and make a note of the error in our solution.
  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);
  const double err1 = (solver.primal_solution() - GetToySolution()).norm();

  // Now set a much tighter eps_abs and solve again.
  ASSERT_TRUE(solver.UpdateEpsAbs(1.0e-7).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);
  const double err2 = (solver.primal_solution() - GetToySolution()).norm();

  // We should have ended up with a significantly smaller error the second time.
  EXPECT_LT(100 * err2, err1);
  // And we should be nearly optimal.
  EXPECT_LT(err2, 1.0e-5);
}